

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_descending_eig(REF_DBL *d)

{
  double dVar1;
  REF_DBL RVar2;
  long lVar3;
  
  dVar1 = *d;
  if (dVar1 < d[1]) {
    *d = d[1];
    d[1] = dVar1;
    lVar3 = -3;
    do {
      RVar2 = d[lVar3 + 6];
      d[lVar3 + 6] = d[lVar3 + 9];
      d[lVar3 + 9] = RVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  dVar1 = *d;
  if (dVar1 < d[2]) {
    *d = d[2];
    d[2] = dVar1;
    lVar3 = 0;
    do {
      RVar2 = d[lVar3 + 3];
      d[lVar3 + 3] = d[lVar3 + 9];
      d[lVar3 + 9] = RVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
  }
  dVar1 = d[1];
  if (dVar1 < d[2]) {
    d[1] = d[2];
    d[2] = dVar1;
    lVar3 = -3;
    do {
      RVar2 = d[lVar3 + 9];
      d[lVar3 + 9] = d[lVar3 + 0xc];
      d[lVar3 + 0xc] = RVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_descending_eig(REF_DBL *d) {
  REF_DBL temp;
  REF_INT i;

  if (ref_matrix_eig(d, 1) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = temp;
    }
  }

  if (ref_matrix_eig(d, 2) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = temp;
    }
  }

  if (ref_matrix_eig(d, 2) > ref_matrix_eig(d, 1)) {
    temp = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = temp;
    }
  }

  return REF_SUCCESS;
}